

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void __thiscall
vkt::ubo::ShaderInterface::getNamedStructs
          (ShaderInterface *this,
          vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
          *structs)

{
  const_iterator this_00;
  bool bVar1;
  reference pSVar2;
  StructType *this_01;
  StructType *local_30;
  __normal_iterator<const_de::SharedPtr<vkt::ubo::StructType>_*,_std::vector<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>_>
  local_28;
  __normal_iterator<const_de::SharedPtr<vkt::ubo::StructType>_*,_std::vector<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>_>
  local_20;
  const_iterator i;
  vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> *structs_local
  ;
  ShaderInterface *this_local;
  
  i._M_current = (SharedPtr<vkt::ubo::StructType> *)structs;
  local_20._M_current =
       (SharedPtr<vkt::ubo::StructType> *)
       std::
       vector<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
       ::begin(&this->m_structs);
  while( true ) {
    local_28._M_current =
         (SharedPtr<vkt::ubo::StructType> *)
         std::
         vector<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
         ::end(&this->m_structs);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_de::SharedPtr<vkt::ubo::StructType>_*,_std::vector<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>_>
             ::operator*(&local_20);
    this_01 = de::SharedPtr<vkt::ubo::StructType>::operator->(pSVar2);
    bVar1 = StructType::hasTypeName(this_01);
    this_00 = i;
    if (bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_de::SharedPtr<vkt::ubo::StructType>_*,_std::vector<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>_>
               ::operator*(&local_20);
      local_30 = de::SharedPtr<vkt::ubo::StructType>::get(pSVar2);
      std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>::
      push_back((vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                 *)this_00._M_current,&local_30);
    }
    __gnu_cxx::
    __normal_iterator<const_de::SharedPtr<vkt::ubo::StructType>_*,_std::vector<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>_>
    ::operator++(&local_20,0);
  }
  return;
}

Assistant:

void ShaderInterface::getNamedStructs (std::vector<const StructType*>& structs) const
{
	for (std::vector<StructTypeSP>::const_iterator i = m_structs.begin(); i != m_structs.end(); i++)
	{
		if ((*i)->hasTypeName())
			structs.push_back((*i).get());
	}
}